

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O3

int hdr_base64_encode(uint8_t *input,size_t input_len,char *output,size_t output_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  auVar10._8_4_ = (int)(input_len >> 0x20);
  auVar10._0_8_ = input_len;
  auVar10._12_4_ = 0x45300000;
  dVar9 = ceil(((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)input_len) - 4503599627370496.0)) / 3.0);
  uVar5 = (ulong)(dVar9 * 4.0);
  iVar4 = 0x16;
  if (((long)(dVar9 * 4.0 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5) == output_len) {
    iVar4 = 0;
    if (output_len == 0 || input_len < 3) {
      lVar7 = 0;
      uVar5 = 0;
    }
    else {
      lVar8 = -3;
      uVar5 = 0;
      lVar7 = 0;
      do {
        bVar1 = input[lVar7];
        bVar2 = input[lVar7 + 1];
        bVar3 = input[lVar7 + 2];
        output[uVar5] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
        output[uVar5 + 1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [((uint)bVar2 * 0x100 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
        output[uVar5 + 2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(uint)bVar2 * 0x100 + (uint)bVar3 >> 6 & 0x3f];
        output[uVar5 + 3] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
        lVar7 = lVar7 + 3;
        uVar5 = uVar5 + 4;
        if (input_len + lVar8 < 3) break;
        lVar8 = lVar8 + -3;
      } while (uVar5 < output_len);
      input_len = input_len - lVar7;
    }
    if (input_len == 1) {
      bVar1 = input[lVar7];
      output[uVar5] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      output[uVar5 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(bVar1 & 3) << 4];
      cVar6 = '=';
    }
    else {
      if (input_len != 2) {
        return 0;
      }
      bVar1 = input[lVar7];
      bVar2 = input[lVar7 + 1];
      output[uVar5] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      output[uVar5 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [((uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
      cVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(bVar2 & 0xf) * 4];
    }
    output[uVar5 + 2] = cVar6;
    output[uVar5 + 3] = '=';
  }
  return iVar4;
}

Assistant:

int hdr_base64_encode(
    const uint8_t* input, size_t input_len, char* output, size_t output_len)
{
    size_t i, j, remaining;

    if (hdr_base64_encoded_len(input_len) != output_len)
    {
        return EINVAL;
    }

    for (i = 0, j = 0; input_len - i >= 3 && j < output_len; i += 3, j += 4)
    {
        hdr_base64_encode_block(&input[i], &output[j]);
    }

    remaining = input_len - i;

    hdr_base64_encode_block_pad(&input[i], &output[j], remaining);

    return 0;
}